

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

MOB_INDEX_DATA * get_mob_index(int vnum)

{
  MOB_INDEX_DATA *pMVar1;
  int in_EDI;
  string_view fmt;
  int local_4;
  
  pMVar1 = (MOB_INDEX_DATA *)(mob_index_hash + in_EDI % 0x400);
  do {
    pMVar1 = pMVar1->next;
    if (pMVar1 == (MOB_INDEX_DATA *)0x0) {
      if (!fBootDb) {
        return pMVar1;
      }
      fmt._M_str = "Get_mob_index: funky vnum {}.";
      fmt._M_len = 0x1d;
      CLogger::Error<int&>((CLogger *)std::ios::widen,fmt,&local_4);
      exit(1);
    }
  } while (pMVar1->vnum != in_EDI);
  return pMVar1;
}

Assistant:

MOB_INDEX_DATA *get_mob_index(int vnum)
{
	MOB_INDEX_DATA *pMobIndex;

	for (pMobIndex = mob_index_hash[vnum % MAX_KEY_HASH]; pMobIndex != nullptr; pMobIndex = pMobIndex->next)
	{
		if (pMobIndex->vnum == vnum)
			return pMobIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_mob_index: funky vnum {}.", vnum);
		exit(1);
	}

	return nullptr;
}